

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Mutex::induceSpuriousWakeupForTest(Mutex *this)

{
  Waiter *other;
  Waiter *waiter;
  Waiter *_waiter497;
  Maybe<kj::_::Mutex::Waiter_&> nextWaiter;
  Mutex *this_local;
  
  nextWaiter.ptr = (Waiter *)this;
  Maybe<kj::_::Mutex::Waiter_&>::Maybe
            ((Maybe<kj::_::Mutex::Waiter_&> *)&_waiter497,&this->waitersHead);
  while( true ) {
    other = readMaybe<kj::_::Mutex::Waiter>((Maybe<kj::_::Mutex::Waiter_&> *)&_waiter497);
    if (other == (Waiter *)0x0) break;
    Maybe<kj::_::Mutex::Waiter_&>::operator=
              ((Maybe<kj::_::Mutex::Waiter_&> *)&_waiter497,&other->next);
    syscall(0xca,&other->futex,0x81,0x7fffffff,0,0,0);
  }
  return;
}

Assistant:

void Mutex::induceSpuriousWakeupForTest() {
  auto nextWaiter = waitersHead;
  for (;;) {
    KJ_IF_SOME(waiter, nextWaiter) {
      nextWaiter = waiter.next;
      syscall(SYS_futex, &waiter.futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
    } else {
      // No more waiters.
      break;
    }
  }